

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::cpp_function,pybind11::none,pybind11::none,char_const(&)[1]>
          (pybind11 *this,cpp_function *args_,none *args__1,none *args__2,char (*args__3) [1])

{
  PyObject *pPVar1;
  undefined8 uVar2;
  long lVar3;
  runtime_error *this_00;
  array<pybind11::object,_4UL> args;
  handle local_30;
  PyObject *local_28;
  PyObject *local_20;
  PyObject *local_18;
  
  pPVar1 = (args_->super_function).super_object.super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_30.m_ptr = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_30.m_ptr = (args_->super_function).super_object.super_handle.m_ptr;
  }
  pPVar1 = (args__1->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_28 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_28 = (args__1->super_object).super_handle.m_ptr;
  }
  pPVar1 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_20 = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_20 = (args__2->super_object).super_handle.m_ptr;
  }
  local_18 = (PyObject *)
             detail::type_caster<char,_void>::cast(*args__3,automatic_reference,(handle)0x0);
  lVar3 = 0;
  do {
    if ((&local_30)[lVar3].m_ptr == (PyObject *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)"
                );
      *(undefined ***)this_00 = &PTR__runtime_error_002618a8;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  tuple::tuple((tuple *)this,4);
  lVar3 = 0;
  do {
    uVar2 = *(undefined8 *)((long)&local_30.m_ptr + lVar3);
    *(undefined8 *)((long)&local_30.m_ptr + lVar3) = 0;
    *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar2;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  lVar3 = 0x18;
  do {
    object::~object((object *)((long)&local_30.m_ptr + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}